

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

ParsedFloat *
absl::strings_internal::ParseFloat<16>(char *begin,char *end,chars_format format_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  bool *pbVar8;
  bool *in_RDX;
  bool *in_RSI;
  ParsedFloat *in_RDI;
  char *exponent_digits_begin;
  bool negative_exponent;
  bool found_exponent;
  char *exponent_begin;
  int post_decimal_digits;
  int zeros_skipped;
  char *begin_zeros;
  int digits_left;
  int pre_decimal_digits;
  bool mantissa_is_inexact;
  int exponent_adjustment;
  uint64_t mantissa;
  char *mantissa_begin;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  bool *dropped_nonzero_digit;
  uint in_stack_ffffffffffffff8c;
  uint uVar9;
  ParsedFloat *out;
  undefined8 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar10;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar11;
  char *in_stack_ffffffffffffffb0;
  int local_38;
  int local_2c;
  bool *local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  out = in_RDI;
  ParsedFloat::ParsedFloat(in_RDI);
  if ((in_RSI != in_RDX) &&
     (bVar1 = absl::anon_unknown_0::ParseInfinityOrNan
                        (in_stack_ffffffffffffff78,
                         (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (ParsedFloat *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
     local_8 = in_RSI, !bVar1)) {
    while( true ) {
      uVar9 = in_stack_ffffffffffffff8c & 0xffffff;
      if (local_8 < in_RDX) {
        uVar9 = CONCAT13(*local_8 == true,(int3)in_stack_ffffffffffffff8c);
      }
      if ((char)(uVar9 >> 0x18) == '\0') break;
      local_8 = local_8 + 1;
      in_stack_ffffffffffffff8c = uVar9;
    }
    local_2c = 0;
    dropped_nonzero_digit = in_RDX;
    absl::anon_unknown_0::MantissaDigitsMax<16>();
    iVar2 = absl::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                      (in_stack_ffffffffffffffb0,
                       (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )),iVar5,&out->mantissa,(bool *)in_RDI);
    local_8 = local_8 + iVar2;
    iVar6 = iVar2;
    iVar3 = absl::anon_unknown_0::DigitLimit<16>();
    if (iVar6 < iVar3) {
      iVar3 = iVar2;
      iVar4 = absl::anon_unknown_0::MantissaDigitsMax<16>();
      if (iVar4 < iVar3) {
        local_2c = absl::anon_unknown_0::MantissaDigitsMax<16>();
        local_2c = iVar2 - local_2c;
        local_38 = 0;
      }
      else {
        local_38 = absl::anon_unknown_0::MantissaDigitsMax<16>();
        local_38 = local_38 - iVar2;
      }
      if ((local_8 < in_RDX) && (*local_8 == true)) {
        pbVar7 = local_8 + 1;
        local_8 = pbVar7;
        while( true ) {
          bVar1 = false;
          if (local_8 < in_RDX) {
            bVar1 = *local_8 == true;
          }
          if (!bVar1) break;
          local_8 = local_8 + 1;
        }
        iVar3 = (int)local_8 - (int)pbVar7;
        iVar2 = iVar3;
        iVar4 = absl::anon_unknown_0::DigitLimit<16>();
        if (iVar4 <= iVar2) {
          return out;
        }
        iVar5 = absl::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                          (in_stack_ffffffffffffffb0,
                           (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                            CONCAT16(in_stack_ffffffffffffffae,
                                                     in_stack_ffffffffffffffa8)),iVar5,
                           &out->mantissa,(bool *)in_RDI);
        local_8 = local_8 + iVar5;
        iVar2 = absl::anon_unknown_0::DigitLimit<16>();
        if (iVar2 <= iVar5) {
          return out;
        }
        if (local_38 < iVar5) {
          iVar5 = local_38;
        }
        local_2c = (local_2c - iVar3) - iVar5;
      }
      if ((in_RSI != local_8) && (((long)local_8 - (long)in_RSI != 1 || (*in_RSI != true)))) {
        in_RDI->mantissa = 0;
        in_RDI->literal_exponent = 0;
        bVar11 = 0;
        pbVar7 = local_8;
        bVar1 = absl::anon_unknown_0::AllowExponent(0);
        if ((bVar1) &&
           ((local_8 < in_RDX &&
            (bVar1 = absl::anon_unknown_0::IsExponentCharacter<16>(*local_8), bVar1)))) {
          bVar10 = 0;
          pbVar8 = local_8 + 1;
          if ((pbVar8 < in_RDX) && (*pbVar8 == true)) {
            bVar10 = 1;
            pbVar8 = local_8 + 2;
          }
          else if ((pbVar8 < in_RDX) && (*pbVar8 == true)) {
            pbVar8 = local_8 + 2;
          }
          local_8 = pbVar8;
          pbVar8 = local_8;
          iVar5 = absl::(anonymous_namespace)::ConsumeDigits<10,int>
                            (local_8,(char *)out,(int)((ulong)in_RDI >> 0x20),
                             (int *)CONCAT44(uVar9,iVar6),dropped_nonzero_digit);
          local_8 = local_8 + iVar5;
          if (local_8 == pbVar8) {
            bVar11 = 0;
            local_8 = pbVar7;
          }
          else {
            bVar11 = 1;
            if ((bVar10 & 1) != 0) {
              in_RDI->literal_exponent = -in_RDI->literal_exponent;
            }
          }
        }
        if (((bVar11 & 1) != 0) || (bVar1 = absl::anon_unknown_0::RequireExponent(0), !bVar1)) {
          in_RDI->type = kNumber;
          if (in_RDI->mantissa == 0) {
            in_RDI->exponent = 0;
          }
          else {
            iVar5 = in_RDI->literal_exponent;
            iVar6 = absl::anon_unknown_0::DigitMagnitude<16>();
            in_RDI->exponent = iVar5 + iVar6 * local_2c;
          }
          in_RDI->end = local_8;
        }
      }
    }
  }
  return out;
}

Assistant:

strings_internal::ParsedFloat ParseFloat(const char* begin, const char* end,
                                         chars_format format_flags) {
  strings_internal::ParsedFloat result;

  // Exit early if we're given an empty range.
  if (begin == end) return result;

  // Handle the infinity and NaN cases.
  if (ParseInfinityOrNan(begin, end, &result)) {
    return result;
  }

  const char* const mantissa_begin = begin;
  while (begin < end && *begin == '0') {
    ++begin;  // skip leading zeros
  }
  uint64_t mantissa = 0;

  int exponent_adjustment = 0;
  bool mantissa_is_inexact = false;
  int pre_decimal_digits = ConsumeDigits<base>(
      begin, end, MantissaDigitsMax<base>(), &mantissa, &mantissa_is_inexact);
  begin += pre_decimal_digits;
  int digits_left;
  if (pre_decimal_digits >= DigitLimit<base>()) {
    // refuse to parse pathological inputs
    return result;
  } else if (pre_decimal_digits > MantissaDigitsMax<base>()) {
    // We dropped some non-fraction digits on the floor.  Adjust our exponent
    // to compensate.
    exponent_adjustment =
        static_cast<int>(pre_decimal_digits - MantissaDigitsMax<base>());
    digits_left = 0;
  } else {
    digits_left =
        static_cast<int>(MantissaDigitsMax<base>() - pre_decimal_digits);
  }
  if (begin < end && *begin == '.') {
    ++begin;
    if (mantissa == 0) {
      // If we haven't seen any nonzero digits yet, keep skipping zeros.  We
      // have to adjust the exponent to reflect the changed place value.
      const char* begin_zeros = begin;
      while (begin < end && *begin == '0') {
        ++begin;
      }
      int zeros_skipped = static_cast<int>(begin - begin_zeros);
      if (zeros_skipped >= DigitLimit<base>()) {
        // refuse to parse pathological inputs
        return result;
      }
      exponent_adjustment -= static_cast<int>(zeros_skipped);
    }
    int post_decimal_digits = ConsumeDigits<base>(
        begin, end, digits_left, &mantissa, &mantissa_is_inexact);
    begin += post_decimal_digits;

    // Since `mantissa` is an integer, each significant digit we read after
    // the decimal point requires an adjustment to the exponent. "1.23e0" will
    // be stored as `mantissa` == 123 and `exponent` == -2 (that is,
    // "123e-2").
    if (post_decimal_digits >= DigitLimit<base>()) {
      // refuse to parse pathological inputs
      return result;
    } else if (post_decimal_digits > digits_left) {
      exponent_adjustment -= digits_left;
    } else {
      exponent_adjustment -= post_decimal_digits;
    }
  }
  // If we've found no mantissa whatsoever, this isn't a number.
  if (mantissa_begin == begin) {
    return result;
  }
  // A bare "." doesn't count as a mantissa either.
  if (begin - mantissa_begin == 1 && *mantissa_begin == '.') {
    return result;
  }

  if (mantissa_is_inexact) {
    // We dropped significant digits on the floor.  Handle this appropriately.
    if (base == 10) {
      // If we truncated significant decimal digits, store the full range of the
      // mantissa for future big integer math for exact rounding.
      result.subrange_begin = mantissa_begin;
      result.subrange_end = begin;
    } else if (base == 16) {
      // If we truncated hex digits, reflect this fact by setting the low
      // ("sticky") bit.  This allows for correct rounding in all cases.
      mantissa |= 1;
    }
  }
  result.mantissa = mantissa;

  const char* const exponent_begin = begin;
  result.literal_exponent = 0;
  bool found_exponent = false;
  if (AllowExponent(format_flags) && begin < end &&
      IsExponentCharacter<base>(*begin)) {
    bool negative_exponent = false;
    ++begin;
    if (begin < end && *begin == '-') {
      negative_exponent = true;
      ++begin;
    } else if (begin < end && *begin == '+') {
      ++begin;
    }
    const char* const exponent_digits_begin = begin;
    // Exponent is always expressed in decimal, even for hexadecimal floats.
    begin += ConsumeDigits<10>(begin, end, kDecimalExponentDigitsMax,
                               &result.literal_exponent, nullptr);
    if (begin == exponent_digits_begin) {
      // there were no digits where we expected an exponent.  We failed to read
      // an exponent and should not consume the 'e' after all.  Rewind 'begin'.
      found_exponent = false;
      begin = exponent_begin;
    } else {
      found_exponent = true;
      if (negative_exponent) {
        result.literal_exponent = -result.literal_exponent;
      }
    }
  }

  if (!found_exponent && RequireExponent(format_flags)) {
    // Provided flags required an exponent, but none was found.  This results
    // in a failure to scan.
    return result;
  }

  // Success!
  result.type = strings_internal::FloatType::kNumber;
  if (result.mantissa > 0) {
    result.exponent = result.literal_exponent +
                      (DigitMagnitude<base>() * exponent_adjustment);
  } else {
    result.exponent = 0;
  }
  result.end = begin;
  return result;
}